

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O1

void __thiscall
cornerstone::raft_server::handle_ext_resp
          (raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  rpc_exception *err_00;
  element_type *peVar1;
  element_type *peVar2;
  resp_msg *resp_00;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar5;
  long *plVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ptr<snapshot> nil_snap;
  undefined1 local_118 [24];
  element_type *local_100 [2];
  element_type local_f0 [2];
  char *local_98;
  char *local_38;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  err_00 = (err->super___shared_ptr<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (err_00 != (rpc_exception *)0x0) {
    handle_ext_resp_err(this,err_00);
    goto LAB_00151c55;
  }
  peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = "Receive an extended %s message from peer %d with Result=%d, Term=%llu, NextIndex=%llu"
  ;
  peVar2 = (resp->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  snprintf((char *)local_100,200,
           "Receive an extended %s message from peer %d with Result=%d, Term=%llu, NextIndex=%llu",
           __msg_type_str[(peVar2->super_msg_base).type_],(ulong)(uint)(peVar2->super_msg_base).src_
           ,(ulong)peVar2->accepted_,(peVar2->super_msg_base).term_,peVar2->next_idx_);
  nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118;
  sVar8 = strlen((char *)local_100);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nil_snap,local_100,(long)local_100 + sVar8);
  (*peVar1->_vptr_logger[2])(peVar1,&nil_snap);
  if (nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_118) {
    operator_delete(nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_118._0_8_ + 1);
  }
  resp_00 = (resp->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch((resp_00->super_msg_base).type_) {
  case sync_log_response:
    peVar3 = (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3 == (element_type *)0x0) goto LAB_00151c55;
    peVar3->current_hb_interval_ = peVar3->hb_interval_;
    uVar9 = resp_00->next_idx_;
    peVar3->next_log_idx_ = uVar9;
    peVar3->matched_idx_ = uVar9 - 1;
    break;
  default:
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = "received an unexpected response message type %s, for safety, stepping down";
    snprintf((char *)local_100,200,
             "received an unexpected response message type %s, for safety, stepping down",
             __msg_type_str[(resp_00->super_msg_base).type_]);
    nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118;
    sVar8 = strlen((char *)local_100);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nil_snap,local_100,(long)local_100 + sVar8);
    (*peVar1->_vptr_logger[5])(peVar1,&nil_snap);
    if (nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_118) {
      operator_delete(nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_118._0_8_ + 1);
    }
    plVar6 = *(long **)&(((this->ctx_)._M_t.
                          super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                          .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                        state_mgr_).
                        super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar6 + 0x40))(plVar6,0xffffffff);
LAB_00152220:
    exit(-1);
  case join_cluster_response:
    if ((this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"no server to join, drop the message","");
      (*peVar1->_vptr_logger[2])(peVar1,local_100);
      goto LAB_00151f6a;
    }
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (resp_00->accepted_ != true) {
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"new server cannot accept the invitation, give up","");
      (*peVar1->_vptr_logger[2])(peVar1,local_100);
      goto LAB_00151fa9;
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"new server confirms it will join, start syncing logs to it","");
    (*peVar1->_vptr_logger[2])(peVar1,local_100);
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0].log_idx_ + 1);
    }
    uVar9 = ((resp->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            next_idx_;
    break;
  case leave_cluster_response:
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (resp_00->accepted_ != false) {
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,
                 "peer accepted to stepping down, removing this server from cluster","");
      (*peVar1->_vptr_logger[2])(peVar1,local_100);
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0].log_idx_ + 1);
      }
      rm_srv_from_cluster(this,(((resp->
                                 super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_msg_base).src_);
      goto LAB_00151c55;
    }
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"peer doesn\'t accept to stepping down, stop proceeding","");
    (*peVar1->_vptr_logger[2])(peVar1,local_100);
LAB_00151fa9:
    if (local_100[0] == local_f0) goto LAB_00151c55;
    goto LAB_00151fb7;
  case install_snapshot_response:
    peVar3 = (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3 == (element_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"no server to join, the response must be very old.","");
      (*peVar1->_vptr_logger[3])(peVar1,local_100);
    }
    else {
      if (resp_00->accepted_ != false) {
        peVar4 = (peVar3->snp_sync_ctx_).
                 super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        this_00 = (peVar3->snp_sync_ctx_).
                  super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (peVar4 == (element_type *)0x0) {
          peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,"Bug! SnapshotSyncContext must not be null","");
          (*peVar1->_vptr_logger[5])(peVar1,local_100);
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0],local_f0[0].log_idx_ + 1);
          }
          plVar6 = *(long **)&(((this->ctx_)._M_t.
                                super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                                .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)
                              ->state_mgr_).
                              super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>
          ;
          (**(code **)(*plVar6 + 0x40))(plVar6,0xffffffff);
          goto LAB_00152220;
        }
        peVar2 = (resp->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        uVar5 = peVar2->next_idx_;
        if (uVar5 < *(ulong *)((long)(peVar4->snapshot_).
                                     super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 0x10)) {
          peVar4->offset_ = uVar5;
          peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_98 = "continue to send snapshot to new server at offset %llu";
          snprintf((char *)local_100,100,"continue to send snapshot to new server at offset %llu",
                   peVar2->next_idx_);
          nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_118;
          sVar8 = strlen((char *)local_100);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nil_snap,local_100,(long)local_100 + sVar8);
          (*peVar1->_vptr_logger[2])(peVar1,&nil_snap);
          if (nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)local_118) {
            operator_delete(nil_snap.
                            super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_118._0_8_ + 1);
          }
        }
        else {
          nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,
                     "snapshot has been copied and applied to new server, continue to sync logs after snapshot"
                     ,"");
          (*peVar1->_vptr_logger[2])(peVar1,local_100);
          if (local_100[0] != local_f0) {
            operator_delete(local_100[0],local_f0[0].log_idx_ + 1);
          }
          peer::set_snapshot_in_sync
                    ((this->srv_to_join_).
                     super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &nil_snap);
          peVar3 = (this->srv_to_join_).
                   super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar9 = ((peVar4->snapshot_).
                   super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  last_log_idx_;
          peVar3->next_log_idx_ = uVar9 + 1;
          peVar3->matched_idx_ = uVar9;
          if (nil_snap.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (nil_snap.
                       super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        sync_log_to_new_srv(this,((this->srv_to_join_).
                                  super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->next_log_idx_);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        goto LAB_00151c55;
      }
      peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"peer doesn\'t accept the snapshot installation request","");
      (*peVar1->_vptr_logger[3])(peVar1,local_100);
    }
LAB_00151f6a:
    if (local_100[0] == local_f0) goto LAB_00151c55;
LAB_00151fb7:
    operator_delete(local_100[0],local_f0[0].log_idx_ + 1);
    goto LAB_00151c55;
  case prevote_response:
    handle_prevote_resp(this,resp_00);
    goto LAB_00151c55;
  }
  sync_log_to_new_srv(this,uVar9);
LAB_00151c55:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return;
}

Assistant:

void raft_server::handle_ext_resp(ptr<resp_msg>& resp, const ptr<rpc_exception>& err)
{
    recur_lock(lock_);
    if (err)
    {
        handle_ext_resp_err(*err);
        return;
    }

    l_->debug(lstrfmt("Receive an extended %s message from peer %d with Result=%d, Term=%llu, NextIndex=%llu")
                  .fmt(
                      __msg_type_str[resp->get_type()],
                      resp->get_src(),
                      resp->get_accepted() ? 1 : 0,
                      resp->get_term(),
                      resp->get_next_idx()));

    switch (resp->get_type())
    {
        case msg_type::sync_log_response:
            if (srv_to_join_)
            {
                // we are reusing heartbeat interval value to indicate when to stop retry
                srv_to_join_->resume_hb_speed();
                srv_to_join_->set_next_log_idx(resp->get_next_idx());
                srv_to_join_->set_matched_idx(resp->get_next_idx() - 1);
                sync_log_to_new_srv(resp->get_next_idx());
            }
            break;
        case msg_type::join_cluster_response:
            if (srv_to_join_)
            {
                if (resp->get_accepted())
                {
                    l_->debug("new server confirms it will join, start syncing logs to it");
                    sync_log_to_new_srv(resp->get_next_idx());
                }
                else
                {
                    l_->debug("new server cannot accept the invitation, give up");
                }
            }
            else
            {
                l_->debug("no server to join, drop the message");
            }
            break;
        case msg_type::leave_cluster_response:
            if (!resp->get_accepted())
            {
                l_->debug("peer doesn't accept to stepping down, stop proceeding");
                return;
            }

            l_->debug("peer accepted to stepping down, removing this server from cluster");
            rm_srv_from_cluster(resp->get_src());
            break;
        case msg_type::install_snapshot_response:
        {
            if (!srv_to_join_)
            {
                l_->info("no server to join, the response must be very old.");
                return;
            }

            if (!resp->get_accepted())
            {
                l_->info("peer doesn't accept the snapshot installation request");
                return;
            }

            ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
            if (sync_ctx == nilptr)
            {
                l_->err("Bug! SnapshotSyncContext must not be null");
                ctx_->state_mgr_->system_exit(-1);
                ::exit(-1);
                return;
            }

            if (resp->get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                // snapshot is done
                ptr<snapshot> nil_snap;
                l_->debug("snapshot has been copied and applied to new server, continue to sync logs after snapshot");
                srv_to_join_->set_snapshot_in_sync(nil_snap);
                srv_to_join_->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                srv_to_join_->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
            }
            else
            {
                sync_ctx->set_offset(resp->get_next_idx());
                l_->debug(sstrfmt("continue to send snapshot to new server at offset %llu").fmt(resp->get_next_idx()));
            }

            sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
        }
        break;
        case msg_type::prevote_response:
            handle_prevote_resp(*resp);
            break;
        default:
            l_->err(lstrfmt("received an unexpected response message type %s, for safety, stepping down")
                        .fmt(__msg_type_str[resp->get_type()]));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            break;
    }
}